

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vfmadd231ps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  undefined4 uVar2;
  long lVar3;
  
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    UVar1 = (pMyDisasm->Reserved_).EVEX.state;
    if (UVar1 == '\x01') {
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    }
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
        if (UVar1 == '\x01') goto LAB_00135184;
LAB_001351a7:
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vfmadd231ps",0xc);
      }
      else {
        if (UVar1 == '\x01') {
LAB_00135184:
          if ((pMyDisasm->Reserved_).EVEX.W == '\0') goto LAB_001351a7;
        }
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vfmadd231pd",0xc);
      }
      ArgsVEX(pMyDisasm);
      uVar2 = 3;
      lVar3 = 0x1c8;
      goto LAB_001351d1;
    }
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  uVar2 = 0xffffffff;
  lVar3 = 0x924;
LAB_001351d1:
  *(undefined4 *)(pMyDisasm->CompleteInstr + lVar3 + -0x14) = uVar2;
  return;
}

Assistant:

void __bea_callspec__ vfmadd231ps_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
       if (GV.VEX.state == InUsePrefix) {
         if (((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) || ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))) {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmadd231ps");
           #endif
         } else {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmadd231pd");
           #endif

         }
         ArgsVEX(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;
       } else {
         failDecode(pMyDisasm);
       }
   }
   else {
       failDecode(pMyDisasm);
   }
}